

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile_next.c
# Opt level: O1

int next_writeheader(t_soundfile *sf,size_t nframes)

{
  int doit;
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  uint32_t n;
  t_nextstep next;
  char local_34 [4];
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t local_20;
  undefined4 local_1c;
  
  doit = soundfile_needsbyteswap(sf);
  if (nframes == 0) {
    n = 0xffffffff;
  }
  else {
    n = (int)nframes * sf->sf_bytesperframe;
  }
  builtin_strncpy(local_34,".snd",4);
  local_30 = swap4(0x1c,doit);
  local_2c = swap4(n,doit);
  local_28 = 0;
  local_24 = swap4(sf->sf_samplerate,doit);
  local_20 = swap4(sf->sf_nchannels,doit);
  local_1c = 0x206450;
  if (sf->sf_bigendian == 0) {
    swapstring4(local_34,1);
  }
  uVar3 = sf->sf_bytespersample - 2;
  iVar1 = 0;
  if (uVar3 < 3) {
    local_28 = swap4(*(uint32_t *)(&DAT_001b01b0 + (ulong)uVar3 * 4),doit);
    sVar2 = fd_write(sf->sf_fd,0,local_34,0x1c);
    iVar1 = -1;
    if (0x1b < sVar2) {
      iVar1 = (int)sVar2;
    }
  }
  return iVar1;
}

Assistant:

static int next_writeheader(t_soundfile *sf, size_t nframes)
{
    int swap = soundfile_needsbyteswap(sf);
    size_t datasize =
        (nframes > 0 ? nframes * sf->sf_bytesperframe : NEXT_UNKNOWN_SIZE);
    off_t headersize = NEXTHEADSIZE;
    ssize_t byteswritten = 0;
    t_nextstep next = {
        ".snd",                                   /* id          */
        swap4((uint32_t)headersize, swap),        /* data onset  */
        swap4((uint32_t)datasize, swap),          /* data length */
        0,                                        /* format      */
        swap4((uint32_t)sf->sf_samplerate, swap), /* sample rate */
        swap4((uint32_t)sf->sf_nchannels, swap),  /* channels    */
        "Pd "                                     /* info string */
    };

    if (!sf->sf_bigendian)
        swapstring4(next.ns_id, 1);
    switch (sf->sf_bytespersample)
    {
        case 2:
            next.ns_format = swap4(NEXT_FORMAT_LINEAR_16, swap);
            break;
        case 3:
            next.ns_format = swap4(NEXT_FORMAT_LINEAR_24, swap);
            break;
        case 4:
            next.ns_format = swap4(NEXT_FORMAT_FLOAT, swap);
            break;
        default: /* unsupported format */
            return 0;
    }

#ifdef DEBUG_SOUNDFILE
    next_posthead(&next, swap);
#endif

    byteswritten = fd_write(sf->sf_fd, 0, &next, headersize);
    return (byteswritten < headersize ? -1 : byteswritten);
}